

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

uint32_t MultipliersToColorCode(VP8LMultipliers *m)

{
  VP8LMultipliers *m_local;
  
  return (uint)m->red_to_blue_ << 0x10 | 0xff000000 | (uint)m->green_to_blue_ << 8 |
         (uint)m->green_to_red_;
}

Assistant:

static WEBP_INLINE uint32_t MultipliersToColorCode(
    const VP8LMultipliers* const m) {
  return 0xff000000u |
         ((uint32_t)(m->red_to_blue_) << 16) |
         ((uint32_t)(m->green_to_blue_) << 8) |
         m->green_to_red_;
}